

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_image.cpp
# Opt level: O0

void __thiscall Bitmap_Operation::BitmapCoreHeader::BitmapCoreHeader(BitmapCoreHeader *this)

{
  BitmapDibHeader *in_RDI;
  
  BitmapDibHeader::BitmapDibHeader(in_RDI);
  in_RDI->_vptr_BitmapDibHeader = (_func_int **)&PTR__BitmapCoreHeader_00142c08;
  *(undefined4 *)&in_RDI[1]._vptr_BitmapDibHeader = 0xc;
  *(undefined2 *)((long)&in_RDI[1]._vptr_BitmapDibHeader + 4) = 0;
  *(undefined2 *)((long)&in_RDI[1]._vptr_BitmapDibHeader + 6) = 0;
  *(undefined2 *)&in_RDI[2]._vptr_BitmapDibHeader = 1;
  *(undefined2 *)((long)&in_RDI[2]._vptr_BitmapDibHeader + 2) = 0;
  *(undefined4 *)((long)&in_RDI[2]._vptr_BitmapDibHeader + 4) = 0xc;
  return;
}

Assistant:

BitmapCoreHeader()
            : bcSize     ( 12 ) // the size of this structure
            , bcWidth    ( 0 )  // width of image
            , bcHeight   ( 0 )  // height of image
            , bcPlanes   ( 1 )  // number of colour planes (always 1)
            , bcBitCount ( 0 )  // bits per pixel
            , overallSize( 12 ) // real size of this structure for bitmap format
        { }